

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iGenfuner.cpp
# Opt level: O2

bool __thiscall Imaginer::Utils::iGenFuner::generater(iGenFuner *this)

{
  double __y;
  int iVar1;
  _funer *p_Var2;
  bool bVar3;
  undefined1 uVar4;
  bool bVar5;
  long lVar6;
  anon_union_8_2_93b31755_for__node *paVar7;
  ostream *poVar8;
  RPNnode *pRVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  iStack<Imaginer::Utils::iRpn::RPNnode> result;
  RPNnode curnode;
  anon_union_8_2_93b31755_for__node local_58;
  iRpn rpn;
  
  iRpn::iRpn(&rpn,this->_expname);
  bVar5 = iRpn::genRpn(&rpn);
  if (bVar5) {
    curnode._node._0_4_ = 0x400;
    iStack<Imaginer::Utils::iRpn::RPNnode>::iStack(&result,(int *)&curnode);
    iVar1 = (rpn._operands)->_top;
    curnode._is = false;
    curnode._node._value = 0.0;
    lVar11 = 0;
    bVar3 = false;
    for (lVar10 = 0; bVar5 = iVar1 < lVar10, lVar10 <= iVar1; lVar10 = lVar10 + 1) {
      pRVar9 = (rpn._operands)->_data;
      if ((RPNnode *)((long)&pRVar9->_node + lVar11) != &curnode) {
        curnode._node = *(anon_union_8_2_93b31755_for__node *)((long)&pRVar9->_node + lVar11);
        curnode._is = (&pRVar9->_is)[lVar11];
      }
      if ((curnode._is & 1U) != 0) {
        lVar6 = (long)result._top;
        result._top = (int)(lVar6 + 1);
        paVar7 = &result._data[lVar6 + 1]._node;
        if (paVar7 != &curnode._node) {
          *paVar7 = curnode._node;
          paVar7[1]._sign = curnode._is;
        }
        poVar8 = operator<<((ostream *)&std::cout,&curnode);
        std::operator<<(poVar8,"\n");
        goto switchD_00104dab_caseD_2c;
      }
      uVar4 = curnode._node._sign;
      if ((curnode._node._sign + 0xa8U & 0xde) == 0) {
        local_58 = (anon_union_8_2_93b31755_for__node)
                   ((ulong)local_58 & 0xffffffffffffff00 | (ulong)curnode._node & 0xff);
        lVar6 = (long)result._top + 1;
        result._top = (int)lVar6;
        result._data[lVar6]._node = local_58;
        result._data[lVar6]._is = false;
        bVar3 = true;
        goto switchD_00104dab_caseD_2c;
      }
      if (result._top < 1) {
        poVar8 = std::operator<<((ostream *)&std::cout,"expression invaild: ");
        poVar8 = std::operator<<(poVar8,uVar4);
        poVar8 = std::operator<<(poVar8," need two operands");
        std::endl<char,std::char_traits<char>>(poVar8);
        goto LAB_00104f26;
      }
      pRVar9 = iStack<Imaginer::Utils::iRpn::RPNnode>::pop(&result);
      dVar12 = (pRVar9->_node)._value;
      pRVar9 = iStack<Imaginer::Utils::iRpn::RPNnode>::pop(&result);
      __y = (pRVar9->_node)._value;
      switch(uVar4) {
      case 0x2a:
        if (bVar3) goto LAB_00104e65;
        dVar12 = dVar12 * __y;
LAB_00104e9f:
        lVar6 = (long)result._top + 1;
        result._top = (int)lVar6;
        result._data[lVar6]._node = (anon_union_8_2_93b31755_for__node)(dVar12 & 0xffffffffffffff00)
        ;
        result._data[lVar6]._is = true;
        break;
      case 0x2b:
        if (!bVar3) {
          dVar12 = dVar12 + __y;
          goto LAB_00104e9f;
        }
        goto LAB_00104e65;
      case 0x2c:
      case 0x2e:
        break;
      case 0x2d:
        if (!bVar3) {
          dVar12 = dVar12 - __y;
          goto LAB_00104e9f;
        }
        goto LAB_00104e65;
      case 0x2f:
        if (!bVar3) {
          dVar12 = dVar12 / __y;
          goto LAB_00104e9f;
        }
LAB_00104e65:
        p_Var2 = (this->_opstream)._data;
        lVar6 = (long)(this->_opstream)._top + 1;
        (this->_opstream)._top = (int)lVar6;
        p_Var2[lVar6]._fun = _funer::_add;
        p_Var2[lVar6]._value = dVar12;
        break;
      default:
        if (uVar4 == '^') {
          if (!bVar3) {
            dVar12 = pow(dVar12,__y);
            goto LAB_00104e9f;
          }
          goto LAB_00104e65;
        }
      }
switchD_00104dab_caseD_2c:
      lVar11 = lVar11 + 0x10;
    }
    poVar8 = operator<<((ostream *)&std::cout,&result);
    std::endl<char,std::char_traits<char>>(poVar8);
LAB_00104f26:
    iStack<Imaginer::Utils::iRpn::RPNnode>::~iStack(&result);
  }
  else {
    bVar5 = false;
  }
  iRpn::~iRpn(&rpn);
  return bVar5;
}

Assistant:

bool   iGenFuner::generater()
{
    iRpn rpn(_expname);
    if(! rpn.genRpn())
        return false;
    iStack<iRpn::RPNnode> result;
    iStack<iRpn::RPNnode>* _operands = rpn.getOperands();
    int size = _operands->size();
    iRpn::RPNnode curnode;    
    char op = '\0';
    bool haveXY = false;
    iRpn::RPNnode  loperand;
    iRpn::RPNnode  roperand;
    bool top_bottom = false;//flag to record a unkowns value is top(true) or bottom(false)
    for(int i = 0;i <= size; ++i)
    {
        curnode = (*_operands)[i];
        if(!curnode)//opearator
        {
            op = curnode;
            if(rpn.isVariable(op))//未知数
            {
                haveXY = true;
                result.push(op);
                if(!result.empty())
                {
                    top_bottom = true;
                }
            }else
            {
                if(result.size() < 1)
                {
                    std::cout << "expression invaild: " << op  <<
                                 " need two operands" << std::endl;
                    return false;
                }
                loperand = result.pop();
                roperand = result.pop();
                switch (op) {
                case '+':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand+roperand);
                    break;
                case '-':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand-roperand);
                    break;
                case '*':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));

                        break;
                    }
                    result.push(loperand*roperand);
                    break;
                case '/':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand/roperand);
                    break;
                case '^':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand^roperand);
                    break;
                default:
                    break;
                }
            }
        }
        else//operand
        {
            result.push(curnode);
            std::cout << curnode << "\n";
        }
    }
    std::cout << result << std::endl;
    //result.destroy();
    return true;
}